

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx2_gemm.h
# Opt level: O0

void intgemm::AVX2::Kernels8::PrepareBTransposed
               (float *input,int8_t *output,float quant_mult,Index cols,Index rows)

{
  FRegister quant_mult_00;
  uint in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  uint in_XMM0_Da;
  undefined1 auVar1 [32];
  Index ri;
  Index c;
  Index r;
  Register *output_it;
  FRegister q;
  Index kColStride;
  Index RegisterElemsInt;
  float in_stack_ffffffffffffff30;
  uint local_94;
  uint local_90;
  uint local_8c;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  Index in_stack_ffffffffffffffa4;
  Index in_stack_ffffffffffffffa8;
  Index cols_left;
  undefined4 uVar2;
  undefined8 *puVar3;
  undefined8 in_stack_ffffffffffffffd0;
  
  uVar2 = 0x20;
  cols_left = 8;
  auVar1 = ZEXT432(in_XMM0_Da);
  local_88 = in_RSI;
  set1_ps<float__vector(8)>(in_stack_ffffffffffffff30);
  local_8c = 0;
  local_90 = 0;
  puVar3 = local_88;
  while (local_8c < in_ECX) {
    for (local_94 = 0; local_94 < 8; local_94 = local_94 + 1) {
      local_80 = auVar1._0_8_;
      uStack_78 = auVar1._8_8_;
      uStack_70 = auVar1._16_8_;
      uStack_68 = auVar1._24_8_;
      quant_mult_00[1] = (float)in_XMM0_Da;
      quant_mult_00[0] = (float)in_EDX;
      quant_mult_00._8_8_ = puVar3;
      quant_mult_00[4] = (float)(int)in_RDI;
      quant_mult_00[5] = (float)(int)((ulong)in_RDI >> 0x20);
      quant_mult_00[6] = (float)(int)in_stack_ffffffffffffffd0;
      quant_mult_00[7] = (float)(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
      QuantizeTile8::ConsecutiveWithWrapping
                (quant_mult_00,(float *)CONCAT44(in_ECX,uVar2),cols_left,in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa4);
      *local_88 = local_80;
      local_88[1] = uStack_78;
      local_88[2] = uStack_70;
      local_88[3] = uStack_68;
      local_88 = local_88 + 4;
    }
    for (local_90 = local_90 + 0x20; in_EDX <= local_90; local_90 = local_90 - in_EDX) {
      local_8c = local_8c + 8;
    }
  }
  return;
}

Assistant:

INTGEMM_AVX2 static void SelectColumnsB(const int8_t *input, int8_t *output, Index rows, const Index *cols_begin, const Index *cols_end) {
    AVX2::SelectColumnsOfB((const __m256i*)input, (__m256i*)output, rows, cols_begin, cols_end);
  }